

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBhash.h
# Opt level: O1

void __thiscall bwtil::DBhash::initAuxHash(DBhash *this)

{
  packed_view_t *this_00;
  size_t sVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  word_type wVar6;
  word_type wVar7;
  int iVar8;
  size_t width;
  ulong uVar9;
  ulint uVar10;
  int iVar12;
  ulong uVar13;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [64];
  pair<unsigned_long,_unsigned_long> pVar15;
  undefined1 local_68 [16];
  pointer local_58;
  size_t local_50;
  size_t sStack_48;
  word_type local_40;
  ulint uVar11;
  undefined1 extraout_var [56];
  
  sVar1 = this->auxiliary_hash_size;
  auVar3 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,this->n + 1);
  auVar14._0_8_ = log2(auVar3._0_8_);
  auVar14._8_56_ = extraout_var;
  auVar3 = vroundsd_avx(auVar14._0_16_,auVar14._0_16_,10);
  width = vcvttsd2usi_avx512f(auVar3);
  bv::internal::packed_view<std::vector>::packed_view
            ((packed_view<std::vector> *)local_68,width,sVar1);
  (this->auxiliary_hash)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_58;
  puVar2 = (this->auxiliary_hash)._bits._container.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->auxiliary_hash)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_68._0_8_;
  (this->auxiliary_hash)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_68._8_8_;
  local_68 = ZEXT816(0) << 0x20;
  local_58 = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  (this->auxiliary_hash)._field_mask = local_40;
  (this->auxiliary_hash)._size = local_50;
  (this->auxiliary_hash)._width = sStack_48;
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_);
  }
  this_00 = &this->auxiliary_hash;
  uVar5 = this->auxiliary_hash_size;
  wVar7 = this->text_fingerprint_length + 1;
  if (uVar5 != 0) {
    iVar12 = -1;
    uVar9 = 0;
    uVar10 = 0;
    do {
      pVar15 = IndexedBWT::BS(&this->indexedBWT,uVar10,this->w_aux,
                              (pair<unsigned_long,_unsigned_long>)ZEXT816(0));
      uVar13 = uVar10 + 1;
      uVar5 = pVar15.first;
      if (pVar15.second <= pVar15.first) {
        uVar5 = wVar7;
      }
      sVar1 = (this->auxiliary_hash)._width;
      bv::internal::bitview<std::vector>::set(&this_00->_bits,uVar10 * sVar1,sVar1 * uVar13,uVar5);
      iVar8 = (int)(uVar9 / this->auxiliary_hash_size);
      if ((iVar12 < iVar8) && (iVar8 % 10 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
        poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% done.",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        iVar12 = iVar8;
      }
      uVar5 = this->auxiliary_hash_size;
      uVar9 = uVar9 + 100;
      uVar10 = uVar13;
    } while (uVar13 < uVar5);
  }
  sVar1 = (this->auxiliary_hash)._width;
  wVar6 = bv::internal::bitview<std::vector>::get(&this_00->_bits,(uVar5 - 1) * sVar1,sVar1 * uVar5)
  ;
  if (wVar6 == wVar7) {
    sVar1 = (this->auxiliary_hash)._width;
    bv::internal::bitview<std::vector>::set
              (&this_00->_bits,(this->auxiliary_hash_size - 1) * sVar1,
               sVar1 * this->auxiliary_hash_size,this->text_fingerprint_length);
  }
  uVar10 = this->auxiliary_hash_size;
  while (uVar11 = uVar10, uVar10 = uVar11 - 1, uVar10 != 0) {
    sVar1 = (this->auxiliary_hash)._width;
    wVar6 = bv::internal::bitview<std::vector>::get
                      (&this_00->_bits,sVar1 * (uVar11 - 2),sVar1 * uVar10);
    if (wVar6 == wVar7) {
      sVar1 = (this->auxiliary_hash)._width;
      wVar6 = bv::internal::bitview<std::vector>::get(&this_00->_bits,sVar1 * uVar10,sVar1 * uVar11)
      ;
      sVar1 = (this->auxiliary_hash)._width;
      bv::internal::bitview<std::vector>::set
                (&this_00->_bits,(uVar11 - 2) * sVar1,sVar1 * uVar10,wVar6);
    }
  }
  return;
}

Assistant:

void initAuxHash(){

		auxiliary_hash =  packed_view_t(ceil(log2(n+1)),auxiliary_hash_size);

		ulint empty = text_fingerprint_length+1;

		int perc,last_perc=-1;

		for (ulint i = 0; i < auxiliary_hash_size; i++){

			pair<ulint,ulint> interval = indexedBWT.BS(i,w_aux);

			if(interval.second>interval.first)
				auxiliary_hash[i] = interval.first;
			else
				auxiliary_hash[i] = empty;

			perc = (100*i)/auxiliary_hash_size;
			if(perc>last_perc and perc%10==0){

				cout << "   " <<  perc << "% done." << endl;
				last_perc=perc;

			}

		}

		if (auxiliary_hash[auxiliary_hash_size-1] == empty)
			auxiliary_hash[auxiliary_hash_size-1] = text_fingerprint_length;

		for (ulint i = auxiliary_hash_size - 1; i >= 1; i--) {

			if (auxiliary_hash[i-1] == empty)
				auxiliary_hash[i-1] = auxiliary_hash.get(i);

		}

	}